

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O3

value_type * __thiscall
FadBinaryMul<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>_>_>_>,_Fad<Fad<double>_>_>
::fastAccessDx(value_type *__return_storage_ptr__,
              FadBinaryMul<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>_>_>_>,_Fad<Fad<double>_>_>
              *this,int i)

{
  uint uVar1;
  uint uVar2;
  Fad<Fad<double>_> *pFVar3;
  Fad<double> *pFVar4;
  double *pdVar5;
  int i_1;
  ulong uVar6;
  value_type vVar7;
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> local_a0;
  FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>
  local_90;
  value_type local_80;
  value_type local_60;
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> local_40;
  
  FadBinaryMul<Fad<Fad<double>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>_>_>
  ::fastAccessDx(&local_60,&this->left_->fadexpr_,i);
  pFVar3 = this->right_;
  local_a0.fadexpr_.right_ = &pFVar3->val_;
  pFVar4 = (pFVar3->dx_).ptr_to_data;
  local_a0.fadexpr_.left_ = &local_60;
  FadBinaryMul<Fad<Fad<double>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>_>_>
  ::val(&local_80,&this->left_->fadexpr_);
  local_40.fadexpr_.left_ = pFVar4 + i;
  local_90.right_ = &local_40;
  local_90.left_ = &local_a0;
  __return_storage_ptr__->val_ =
       pFVar4[i].val_ * local_80.val_ + local_60.val_ * (pFVar3->val_).val_;
  uVar1 = (pFVar3->val_).dx_.num_elts;
  if ((int)uVar1 < local_60.dx_.num_elts) {
    uVar1 = local_60.dx_.num_elts;
  }
  uVar2 = pFVar4[i].dx_.num_elts;
  if (local_80.dx_.num_elts < (int)uVar2) {
    local_80.dx_.num_elts = uVar2;
  }
  uVar2 = local_80.dx_.num_elts;
  if (local_80.dx_.num_elts < (int)uVar1) {
    uVar2 = uVar1;
  }
  (__return_storage_ptr__->dx_).num_elts = 0;
  (__return_storage_ptr__->dx_).ptr_to_data = (double *)0x0;
  local_40.fadexpr_.right_ = &local_80;
  if ((int)uVar2 < 1) {
    __return_storage_ptr__->defaultVal = 0.0;
  }
  else {
    (__return_storage_ptr__->dx_).num_elts = uVar2;
    pdVar5 = (double *)operator_new__((ulong)uVar2 * 8);
    (__return_storage_ptr__->dx_).ptr_to_data = pdVar5;
    __return_storage_ptr__->defaultVal = 0.0;
    uVar6 = 0;
    do {
      vVar7 = FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>
              ::dx(&local_90,(int)uVar6);
      pdVar5[uVar6] = vVar7;
      uVar6 = uVar6 + 1;
    } while (uVar2 != uVar6);
  }
  Fad<double>::~Fad(&local_80);
  Fad<double>::~Fad(&local_60);
  return __return_storage_ptr__;
}

Assistant:

value_type fastAccessDx(int i) const { return left_.fastAccessDx(i) * right_.val() + right_.fastAccessDx(i) * left_.val();}